

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

int32_t ures_getFunctionalEquivalent_63
                  (char *result,int32_t resultCapacity,char *path,char *resName,char *keyword,
                  char *locid,UBool *isAvailable,UBool omitDefault,UErrorCode *status)

{
  int iVar1;
  uint uVar2;
  UEnumeration *en;
  char *pcVar3;
  UResourceBundle *pUVar4;
  size_t sVar5;
  size_t sVar6;
  UChar *pUVar7;
  UBool UVar8;
  int32_t iVar9;
  int32_t x;
  UResourceBundle bund1;
  UResourceBundle bund2;
  char full [1024];
  char found [1024];
  char kwVal [1024];
  char defVal [1024];
  char defLoc [1024];
  char parent [1024];
  char base [1024];
  UErrorCode local_1e00;
  int local_1dfc;
  UChar *local_1df8;
  int32_t local_1dec;
  char *local_1de8;
  char *local_1de0;
  char *local_1dd8;
  char *local_1dd0;
  UResourceBundle local_1dc8;
  UResourceBundle local_1d00;
  char local_1c38 [1024];
  int local_1838;
  char local_1834;
  char local_1438;
  undefined7 uStack_1437;
  char local_1038 [1024];
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  iVar9 = 0;
  local_1de0 = resName;
  memset(&local_1438,0,0x400);
  memset(local_1038,0,0x400);
  memset(local_c38,0,0x400);
  memset(local_438,0,0x400);
  memset(local_1c38,0,0x400);
  local_1e00 = U_ZERO_ERROR;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_1dd0 = result;
    uloc_getKeywordValue_63(locid,keyword,&local_1438,0x3ff,&local_1e00);
    if (CONCAT71(uStack_1437,local_1438) == 0x746c7561666564) {
      local_1438 = '\0';
    }
    uloc_getBaseName_63(locid,local_438,0x3ff,&local_1e00);
    memset(&local_1dc8,0,200);
    memset(&local_1d00,0,200);
    strcpy(local_838,local_438);
    strcpy((char *)&local_1838,local_438);
    if (isAvailable != (UBool *)0x0) {
      en = ures_openAvailableLocales_63(path,&local_1e00);
      *isAvailable = '\x01';
      if (local_1e00 < U_ILLEGAL_ARGUMENT_ERROR) {
        local_1dec = resultCapacity;
        local_1de8 = keyword;
        do {
          UVar8 = '\0';
          pcVar3 = uenum_next_63(en,(int32_t *)0x0,&local_1e00);
          if (pcVar3 == (char *)0x0) goto LAB_002ca55a;
          iVar1 = strcmp(pcVar3,local_838);
        } while (iVar1 != 0);
        UVar8 = '\x01';
LAB_002ca55a:
        *isAvailable = UVar8;
        keyword = local_1de8;
        resultCapacity = local_1dec;
      }
      uenum_close_63(en);
    }
    if (local_1e00 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_1dec = resultCapacity;
      local_1de8 = keyword;
      do {
        local_1e00 = U_ZERO_ERROR;
        pUVar4 = ures_openWithType((UResourceBundle *)0x0,path,local_838,
                                   URES_OPEN_LOCALE_DEFAULT_ROOT,&local_1e00);
        if (isAvailable != (UBool *)0x0 &&
            (local_1e00 & ~U_ILLEGAL_ARGUMENT_ERROR) == U_ERROR_WARNING_START) {
          *isAvailable = '\0';
        }
        if (local_1e00 < U_ILLEGAL_ARGUMENT_ERROR) {
          if ((((local_1e00 == U_ZERO_ERROR) &&
               (ures_getByKey_63(pUVar4,local_1de0,&local_1dc8,&local_1e00),
               local_1e00 == U_ZERO_ERROR)) &&
              (pUVar7 = ures_getStringByKey_63(&local_1dc8,"default",&local_1dfc,&local_1e00),
              local_1e00 < U_ILLEGAL_ARGUMENT_ERROR)) && (local_1dfc != 0)) {
            iVar9 = u_strlen_63(pUVar7);
            u_UCharsToChars_63(pUVar7,local_1038,iVar9);
            strcpy(local_c38,local_838);
            if (local_1438 == '\0') {
              strcpy(&local_1438,local_1038);
            }
          }
        }
        else {
          *status = local_1e00;
        }
        local_1e00 = U_ZERO_ERROR;
        if (pUVar4 != (UResourceBundle *)0x0) {
          strcpy((char *)&local_1838,pUVar4->fTopLevelData->fName);
        }
        uloc_getParent_63((char *)&local_1838,local_838,0x400,&local_1e00);
        ures_closeBundle(pUVar4,'\x01');
      } while (((local_1038[0] == '\0') && ((char)local_1838 != '\0')) &&
              ((local_1834 != '\0' || local_1838 != 0x746f6f72 &&
               (isAvailable = (UBool *)0x0, *status < U_ILLEGAL_ARGUMENT_ERROR))));
      strcpy(local_838,local_438);
      strcpy((char *)&local_1838,local_438);
      local_1dd8 = &local_1438;
      do {
        local_1e00 = U_ZERO_ERROR;
        pUVar4 = ures_openWithType((UResourceBundle *)0x0,path,local_838,
                                   URES_OPEN_LOCALE_DEFAULT_ROOT,&local_1e00);
        if (local_1e00 < U_ILLEGAL_ARGUMENT_ERROR) {
          if (((local_1e00 == U_ZERO_ERROR) &&
              (ures_getByKey_63(pUVar4,local_1de0,&local_1dc8,&local_1e00),
              local_1e00 == U_ZERO_ERROR)) &&
             (ures_getByKey_63(&local_1dc8,&local_1438,&local_1d00,&local_1e00),
             local_1e00 == U_ZERO_ERROR)) {
            strcpy(local_1c38,local_838);
            if (local_1c38[0] == '\0') {
              builtin_strncpy(local_1c38,"root",5);
            }
            local_1df8 = (UChar *)strlen(local_c38);
            pUVar7 = (UChar *)strlen(local_1c38);
            if (((pUVar7 < local_1df8) &&
                (pUVar7 = ures_getStringByKey_63(&local_1dc8,"default",&local_1dfc,&local_1e00),
                local_1e00 < U_ILLEGAL_ARGUMENT_ERROR)) && (local_1dfc != 0)) {
              local_1df8 = pUVar7;
              iVar9 = u_strlen_63(pUVar7);
              u_UCharsToChars_63(local_1df8,local_1038,iVar9);
              strcpy(local_c38,local_1c38);
            }
          }
        }
        else {
          *status = local_1e00;
        }
        local_1e00 = U_ZERO_ERROR;
        strcpy((char *)&local_1838,local_838);
        uloc_getParent_63((char *)&local_1838,local_838,0x3ff,&local_1e00);
        ures_closeBundle(pUVar4,'\x01');
      } while (((local_1c38[0] == '\0') && ((char)local_1838 != '\0')) &&
              (*status < U_ILLEGAL_ARGUMENT_ERROR));
      if ((local_1c38[0] == '\0') && (iVar1 = strcmp(&local_1438,local_1038), iVar1 != 0)) {
        strcpy(&local_1438,local_1038);
        strcpy(local_838,local_438);
        strcpy((char *)&local_1838,local_438);
        do {
          local_1e00 = U_ZERO_ERROR;
          pUVar4 = ures_openWithType((UResourceBundle *)0x0,path,local_838,
                                     URES_OPEN_LOCALE_DEFAULT_ROOT,&local_1e00);
          if (local_1e00 < U_ILLEGAL_ARGUMENT_ERROR) {
            if (((local_1e00 == U_ZERO_ERROR) &&
                (ures_getByKey_63(pUVar4,local_1de0,&local_1dc8,&local_1e00),
                local_1e00 == U_ZERO_ERROR)) &&
               (ures_getByKey_63(&local_1dc8,&local_1438,&local_1d00,&local_1e00),
               local_1e00 == U_ZERO_ERROR)) {
              strcpy(local_1c38,local_838);
              if (local_1c38[0] == '\0') {
                builtin_strncpy(local_1c38,"root",5);
              }
              local_1df8 = (UChar *)strlen(local_c38);
              pUVar7 = (UChar *)strlen(local_1c38);
              if (((pUVar7 < local_1df8) &&
                  (pUVar7 = ures_getStringByKey_63(&local_1dc8,"default",&local_1dfc,&local_1e00),
                  local_1e00 < U_ILLEGAL_ARGUMENT_ERROR)) && (local_1dfc != 0)) {
                local_1df8 = pUVar7;
                iVar9 = u_strlen_63(pUVar7);
                u_UCharsToChars_63(local_1df8,local_1038,iVar9);
                strcpy(local_c38,local_1c38);
              }
            }
          }
          else {
            *status = local_1e00;
          }
          local_1e00 = U_ZERO_ERROR;
          strcpy((char *)&local_1838,local_838);
          uloc_getParent_63((char *)&local_1838,local_838,0x3ff,&local_1e00);
          ures_closeBundle(pUVar4,'\x01');
        } while (((local_1c38[0] == '\0') && ((char)local_1838 != '\0')) &&
                (*status < U_ILLEGAL_ARGUMENT_ERROR));
      }
      pcVar3 = local_1dd0;
      iVar9 = local_1dec;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (local_1c38[0] == '\0') {
          *status = U_MISSING_RESOURCE_ERROR;
        }
        else if (omitDefault != '\0') {
          sVar5 = strlen(local_c38);
          sVar6 = strlen(local_1c38);
          if ((sVar5 <= sVar6) && (iVar1 = strcmp(&local_1438,local_1038), iVar1 == 0)) {
            local_1438 = '\0';
          }
        }
        strcpy((char *)&local_1838,local_1c38);
        if ((local_1438 != '\0') || (local_1dd8 = local_1038, omitDefault == '\0')) {
          sVar5 = strlen((char *)&local_1838);
          *(undefined2 *)((long)&local_1838 + sVar5) = 0x40;
          strcat((char *)&local_1838,local_1de8);
          sVar5 = strlen((char *)&local_1838);
          *(undefined2 *)((long)&local_1838 + sVar5) = 0x3d;
          strcat((char *)&local_1838,local_1dd8);
        }
      }
      ures_closeBundle(&local_1dc8,'\x01');
      ures_closeBundle(&local_1d00,'\x01');
      sVar5 = strlen((char *)&local_1838);
      x = (int32_t)sVar5;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar2 = uprv_min_63(x,iVar9);
        if (0 < (int)uVar2) {
          strncpy(pcVar3,(char *)&local_1838,(ulong)uVar2);
        }
        if (x == 0) {
          *status = U_MISSING_RESOURCE_ERROR;
        }
      }
      else {
        *pcVar3 = '\0';
        x = 0;
      }
      iVar9 = u_terminateChars_63(pcVar3,iVar9,x,status);
    }
    else {
      *status = local_1e00;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ures_getFunctionalEquivalent(char *result, int32_t resultCapacity,
                             const char *path, const char *resName, const char *keyword, const char *locid,
                             UBool *isAvailable, UBool omitDefault, UErrorCode *status)
{
    char kwVal[1024] = ""; /* value of keyword 'keyword' */
    char defVal[1024] = ""; /* default value for given locale */
    char defLoc[1024] = ""; /* default value for given locale */
    char base[1024] = ""; /* base locale */
    char found[1024];
    char parent[1024];
    char full[1024] = "";
    UResourceBundle bund1, bund2;
    UResourceBundle *res = NULL;
    UErrorCode subStatus = U_ZERO_ERROR;
    int32_t length = 0;
    if(U_FAILURE(*status)) return 0;
    uloc_getKeywordValue(locid, keyword, kwVal, 1024-1,&subStatus);
    if(!uprv_strcmp(kwVal, DEFAULT_TAG)) {
        kwVal[0]=0;
    }
    uloc_getBaseName(locid, base, 1024-1,&subStatus);
#if defined(URES_TREE_DEBUG)
    fprintf(stderr, "getFunctionalEquivalent: \"%s\" [%s=%s] in %s - %s\n", 
            locid, keyword, kwVal, base, u_errorName(subStatus));
#endif
    ures_initStackObject(&bund1);
    ures_initStackObject(&bund2);
    
    
    uprv_strcpy(parent, base);
    uprv_strcpy(found, base);

    if(isAvailable) { 
        UEnumeration *locEnum = ures_openAvailableLocales(path, &subStatus);
        *isAvailable = TRUE;
        if (U_SUCCESS(subStatus)) {
            *isAvailable = isLocaleInList(locEnum, parent, &subStatus);
        }
        uenum_close(locEnum);
    }

    if(U_FAILURE(subStatus)) {
        *status = subStatus;
        return 0;
    }
    
    do {
        subStatus = U_ZERO_ERROR;
        res = ures_open(path, parent, &subStatus);
        if(((subStatus == U_USING_FALLBACK_WARNING) ||
            (subStatus == U_USING_DEFAULT_WARNING)) && isAvailable)
        {
            *isAvailable = FALSE;
        }
        isAvailable = NULL; /* only want to set this the first time around */
        
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "%s;%s -> %s [%s]\n", path?path:"ICUDATA", parent, u_errorName(subStatus), ures_getLocale(res, &subStatus));
#endif
        if(U_FAILURE(subStatus)) {
            *status = subStatus;
        } else if(subStatus == U_ZERO_ERROR) {
            ures_getByKey(res,resName,&bund1, &subStatus);
            if(subStatus == U_ZERO_ERROR) {
                const UChar *defUstr;
                int32_t defLen;
                /* look for default item */
#if defined(URES_TREE_DEBUG)
                fprintf(stderr, "%s;%s : loaded default -> %s\n",
                    path?path:"ICUDATA", parent, u_errorName(subStatus));
#endif
                defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                if(U_SUCCESS(subStatus) && defLen) {
                    u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s;%s -> default %s=%s,  %s\n", 
                        path?path:"ICUDATA", parent, keyword, defVal, u_errorName(subStatus));
#endif
                    uprv_strcpy(defLoc, parent);
                    if(kwVal[0]==0) {
                        uprv_strcpy(kwVal, defVal);
#if defined(URES_TREE_DEBUG)
                        fprintf(stderr, "%s;%s -> kwVal =  %s\n", 
                            path?path:"ICUDATA", parent, keyword, kwVal);
#endif
                    }
                }
            }
        }
        
        subStatus = U_ZERO_ERROR;

        if (res != NULL) {
            uprv_strcpy(found, ures_getLocaleByType(res, ULOC_VALID_LOCALE, &subStatus));
        }

        uloc_getParent(found,parent,sizeof(parent),&subStatus);
        ures_close(res);
    } while(!defVal[0] && *found && uprv_strcmp(found, "root") != 0 && U_SUCCESS(*status));
    
    /* Now, see if we can find the kwVal collator.. start the search over.. */
    uprv_strcpy(parent, base);
    uprv_strcpy(found, base);
    
    do {
        subStatus = U_ZERO_ERROR;
        res = ures_open(path, parent, &subStatus);
        if((subStatus == U_USING_FALLBACK_WARNING) && isAvailable) {
            *isAvailable = FALSE;
        }
        isAvailable = NULL; /* only want to set this the first time around */
        
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "%s;%s -> %s (looking for %s)\n", 
            path?path:"ICUDATA", parent, u_errorName(subStatus), kwVal);
#endif
        if(U_FAILURE(subStatus)) {
            *status = subStatus;
        } else if(subStatus == U_ZERO_ERROR) {
            ures_getByKey(res,resName,&bund1, &subStatus);
#if defined(URES_TREE_DEBUG)
/**/ fprintf(stderr,"@%d [%s] %s\n", __LINE__, resName, u_errorName(subStatus));
#endif
            if(subStatus == U_ZERO_ERROR) {
                ures_getByKey(&bund1, kwVal, &bund2, &subStatus);
#if defined(URES_TREE_DEBUG)
/**/ fprintf(stderr,"@%d [%s] %s\n", __LINE__, kwVal, u_errorName(subStatus));
#endif
                if(subStatus == U_ZERO_ERROR) {
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s;%s -> full0 %s=%s,  %s\n", 
                        path?path:"ICUDATA", parent, keyword, kwVal, u_errorName(subStatus));
#endif
                    uprv_strcpy(full, parent);
                    if(*full == 0) {
                        uprv_strcpy(full, "root");
                    }
                        /* now, recalculate default kw if need be */
                        if(uprv_strlen(defLoc) > uprv_strlen(full)) {
                          const UChar *defUstr;
                          int32_t defLen;
                          /* look for default item */
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> recalculating Default0\n", 
                                    path?path:"ICUDATA", full);
#endif
                          defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                          if(U_SUCCESS(subStatus) && defLen) {
                            u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> default0 %s=%s,  %s\n", 
                                    path?path:"ICUDATA", full, keyword, defVal, u_errorName(subStatus));
#endif
                            uprv_strcpy(defLoc, full);
                          }
                        } /* end of recalculate default KW */
#if defined(URES_TREE_DEBUG)
                        else {
                          fprintf(stderr, "No trim0,  %s <= %s\n", defLoc, full);
                        }
#endif
                } else {
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "err=%s in %s looking for %s\n", 
                        u_errorName(subStatus), parent, kwVal);
#endif
                }
            }
        }
        
        subStatus = U_ZERO_ERROR;
        
        uprv_strcpy(found, parent);
        uloc_getParent(found,parent,1023,&subStatus);
        ures_close(res);
    } while(!full[0] && *found && U_SUCCESS(*status));
    
    if((full[0]==0) && uprv_strcmp(kwVal, defVal)) {
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "Failed to locate kw %s - try default %s\n", kwVal, defVal);
#endif
        uprv_strcpy(kwVal, defVal);
        uprv_strcpy(parent, base);
        uprv_strcpy(found, base);
        
        do { /* search for 'default' named item */
            subStatus = U_ZERO_ERROR;
            res = ures_open(path, parent, &subStatus);
            if((subStatus == U_USING_FALLBACK_WARNING) && isAvailable) {
                *isAvailable = FALSE;
            }
            isAvailable = NULL; /* only want to set this the first time around */
            
#if defined(URES_TREE_DEBUG)
            fprintf(stderr, "%s;%s -> %s (looking for default %s)\n",
                path?path:"ICUDATA", parent, u_errorName(subStatus), kwVal);
#endif
            if(U_FAILURE(subStatus)) {
                *status = subStatus;
            } else if(subStatus == U_ZERO_ERROR) {
                ures_getByKey(res,resName,&bund1, &subStatus);
                if(subStatus == U_ZERO_ERROR) {
                    ures_getByKey(&bund1, kwVal, &bund2, &subStatus);
                    if(subStatus == U_ZERO_ERROR) {
#if defined(URES_TREE_DEBUG)
                        fprintf(stderr, "%s;%s -> full1 %s=%s,  %s\n", path?path:"ICUDATA",
                            parent, keyword, kwVal, u_errorName(subStatus));
#endif
                        uprv_strcpy(full, parent);
                        if(*full == 0) {
                            uprv_strcpy(full, "root");
                        }
                        
                        /* now, recalculate default kw if need be */
                        if(uprv_strlen(defLoc) > uprv_strlen(full)) {
                          const UChar *defUstr;
                          int32_t defLen;
                          /* look for default item */
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> recalculating Default1\n", 
                                    path?path:"ICUDATA", full);
#endif
                          defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                          if(U_SUCCESS(subStatus) && defLen) {
                            u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> default %s=%s,  %s\n", 
                                    path?path:"ICUDATA", full, keyword, defVal, u_errorName(subStatus));
#endif
                            uprv_strcpy(defLoc, full);
                          }
                        } /* end of recalculate default KW */
#if defined(URES_TREE_DEBUG)
                        else {
                          fprintf(stderr, "No trim1,  %s <= %s\n", defLoc, full);
                        }
#endif
                    }
                }
            }
            subStatus = U_ZERO_ERROR;
            
            uprv_strcpy(found, parent);
            uloc_getParent(found,parent,1023,&subStatus);
            ures_close(res);
        } while(!full[0] && *found && U_SUCCESS(*status));
    }
    
    if(U_SUCCESS(*status)) {
        if(!full[0]) {
#if defined(URES_TREE_DEBUG)
          fprintf(stderr, "Still could not load keyword %s=%s\n", keyword, kwVal);
#endif
          *status = U_MISSING_RESOURCE_ERROR;
        } else if(omitDefault) {
#if defined(URES_TREE_DEBUG)
          fprintf(stderr,"Trim? full=%s, defLoc=%s, found=%s\n", full, defLoc, found);
#endif        
          if(uprv_strlen(defLoc) <= uprv_strlen(full)) {
            /* found the keyword in a *child* of where the default tag was present. */
            if(!uprv_strcmp(kwVal, defVal)) { /* if the requested kw is default, */
              /* and the default is in or in an ancestor of the current locale */
#if defined(URES_TREE_DEBUG)
              fprintf(stderr, "Removing unneeded var %s=%s\n", keyword, kwVal);
#endif
              kwVal[0]=0;
            }
          }
        }
        uprv_strcpy(found, full);
        if(kwVal[0]) {
            uprv_strcat(found, "@");
            uprv_strcat(found, keyword);
            uprv_strcat(found, "=");
            uprv_strcat(found, kwVal);
        } else if(!omitDefault) {
            uprv_strcat(found, "@");
            uprv_strcat(found, keyword);
            uprv_strcat(found, "=");
            uprv_strcat(found, defVal);
        }
    }
    /* we found the default locale - no need to repeat it.*/
    
    ures_close(&bund1);
    ures_close(&bund2);
    
    length = (int32_t)uprv_strlen(found);

    if(U_SUCCESS(*status)) {
        int32_t copyLength = uprv_min(length, resultCapacity);
        if(copyLength>0) {
            uprv_strncpy(result, found, copyLength);
        }
        if(length == 0) {
          *status = U_MISSING_RESOURCE_ERROR; 
        }
    } else {
        length = 0;
        result[0]=0;
    }
    return u_terminateChars(result, resultCapacity, length, status);
}